

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureRunner.cpp
# Opt level: O2

int __thiscall ut11::detail::TestFixtureRunner::Run(TestFixtureRunner *this,Output *output)

{
  TestFixtureResults TVar1;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  fixtures;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  vStack_48;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  local_30;
  
  (*output->_vptr_Output[2])(output);
  GetFixtures(&local_30,this);
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::vector(&vStack_48,&local_30);
  TVar1 = RunTestFixtures(&vStack_48,output);
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::~vector(&vStack_48);
  (*output->_vptr_Output[3])(output,TVar1.ran,TVar1.succeeded);
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::~vector(&local_30);
  return (int)TVar1.ran - (int)TVar1.succeeded;
}

Assistant:

int ut11::detail::TestFixtureRunner::Run(out::Output& output)
{
	output.Begin();

	auto fixtures = GetFixtures();
	auto results = RunTestFixtures(fixtures, output);

	output.Finish(results.ran, results.succeeded);
	return results.ran - results.succeeded;
}